

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deflate.h
# Opt level: O2

void __thiscall DeflateEncoder::DeflateEncoder(DeflateEncoder *this,string *message)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)message);
  Cryptor::Cryptor(&this->super_Cryptor,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_Cryptor)._vptr_Cryptor = (_func_int **)&PTR__Cryptor_0010dc70;
  (this->super_Cryptor).show_ = true;
  return;
}

Assistant:

explicit DeflateEncoder(const std::string& message) : Cryptor(message) { set_show(true); }